

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,char *__file,__off_t __length
          )

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar2;
  ClientHook *pCVar3;
  Disposer *pDVar4;
  __off_t extraout_RDX;
  
  pMVar1 = this->ptr;
  pMVar2 = this->pos;
  while (pMVar1 + (long)__file < pMVar2) {
    this->pos = pMVar2 + -1;
    pCVar3 = pMVar2[-1].ptr.ptr;
    if (pCVar3 != (ClientHook *)0x0) {
      pMVar2[-1].ptr.ptr = (ClientHook *)0x0;
      pDVar4 = pMVar2[-1].ptr.disposer;
      (*(code *)**(undefined8 **)pDVar4)
                (pDVar4,pCVar3->_vptr_ClientHook[-2] + (long)&pCVar3->_vptr_ClientHook,__length);
      __length = extraout_RDX;
    }
    pMVar2 = this->pos;
  }
  return (int)pMVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }